

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O0

LiteralType ManyDoublesRoundtripTest::ClassifyDouble(uint64_t double_bits)

{
  bool bVar1;
  uint64_t double_bits_local;
  
  bVar1 = is_infinity_or_nan(double_bits);
  if (bVar1) {
    if ((double_bits & 0xfffffffffffff) == 0) {
      double_bits_local._4_4_ = Infinity;
    }
    else {
      double_bits_local._4_4_ = Nan;
    }
  }
  else {
    double_bits_local._4_4_ = Hexfloat;
  }
  return double_bits_local._4_4_;
}

Assistant:

static LiteralType ClassifyDouble(uint64_t double_bits) {
    if (is_infinity_or_nan(double_bits)) {
      if (double_bits & 0xfffffffffffffULL) {
        return LiteralType::Nan;
      } else {
        return LiteralType::Infinity;
      }
    } else {
      return LiteralType::Hexfloat;
    }
  }